

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O1

int lj_cconv_compatptr(CTState *cts,CType *d,CType *s,CTInfo flags)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  CType *pCVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  if (d == s || (flags & 1) != 0) {
    return 1;
  }
  pCVar4 = cts->tab;
  uVar6 = 0;
  while( true ) {
    do {
      uVar1 = (ushort)d->info;
      d = pCVar4 + uVar1;
      uVar2 = pCVar4[uVar1].info;
      uVar9 = uVar2 >> 0x1c;
    } while (uVar9 == 5);
    if (uVar9 != 8) break;
    if ((uVar2 & 0xff0000) == 0x10000) {
      uVar6 = uVar6 | d->size;
    }
  }
  uVar8 = 0;
  if ((s->info & 0xf0000000) != 0x10000000) {
    uVar8 = 0;
    while( true ) {
      do {
        uVar1 = (ushort)s->info;
        s = pCVar4 + uVar1;
        uVar3 = pCVar4[uVar1].info;
      } while (uVar3 >> 0x1c == 5);
      if (uVar3 >> 0x1c != 8) break;
      if ((uVar3 & 0xff0000) == 0x10000) {
        uVar8 = uVar8 | s->size;
      }
    }
    uVar8 = uVar3 & 0x3000000 | uVar8;
  }
  uVar6 = uVar2 & 0x3000000 | uVar6;
  if ((flags & 4) == 0) {
    if ((flags & 8) != 0) goto LAB_001501ac;
    iVar7 = 0;
    bVar5 = false;
    if ((uVar8 & ~uVar6) != 0) goto LAB_00150212;
    iVar7 = 1;
    if (((uVar2 & 0xf0000000) != 0x40000000) && ((s->info & 0xf0000000) != 0x40000000))
    goto LAB_001501ac;
LAB_001501fd:
    bVar5 = false;
  }
  else {
    iVar7 = 0;
    bVar5 = false;
    if (uVar6 != uVar8) goto LAB_00150212;
LAB_001501ac:
    iVar7 = 0;
    bVar5 = false;
    if ((uVar9 != s->info >> 0x1c) || (iVar7 = 0, d->size != s->size)) goto LAB_00150212;
    if (uVar2 < 0x10000000) {
      iVar7 = 0;
      if (((s->info ^ uVar2) & 0xc000000) != 0) goto LAB_00150212;
    }
    else {
      if ((uVar2 & 0xe0000000) == 0x20000000) {
        iVar7 = lj_cconv_compatptr(cts,d,s,flags | 4);
        goto LAB_001501fd;
      }
      if ((uVar9 == 1) && (iVar7 = 0, d != s)) goto LAB_00150212;
    }
    iVar7 = 0;
    bVar5 = true;
  }
LAB_00150212:
  if (bVar5) {
    return 1;
  }
  return iVar7;
}

Assistant:

int lj_cconv_compatptr(CTState *cts, CType *d, CType *s, CTInfo flags)
{
  if (!((flags & CCF_CAST) || d == s)) {
    CTInfo dqual = 0, squal = 0;
    d = cconv_childqual(cts, d, &dqual);
    if (!ctype_isstruct(s->info))
      s = cconv_childqual(cts, s, &squal);
    if ((flags & CCF_SAME)) {
      if (dqual != squal)
	return 0;  /* Different qualifiers. */
    } else if (!(flags & CCF_IGNQUAL)) {
      if ((dqual & squal) != squal)
	return 0;  /* Discarded qualifiers. */
      if (ctype_isvoid(d->info) || ctype_isvoid(s->info))
	return 1;  /* Converting to/from void * is always ok. */
    }
    if (ctype_type(d->info) != ctype_type(s->info) ||
	d->size != s->size)
      return 0;  /* Different type or different size. */
    if (ctype_isnum(d->info)) {
      if (((d->info ^ s->info) & (CTF_BOOL|CTF_FP)))
	return 0;  /* Different numeric types. */
    } else if (ctype_ispointer(d->info)) {
      /* Check child types for compatibility. */
      return lj_cconv_compatptr(cts, d, s, flags|CCF_SAME);
    } else if (ctype_isstruct(d->info)) {
      if (d != s)
	return 0;  /* Must be exact same type for struct/union. */
    } else if (ctype_isfunc(d->info)) {
      /* NYI: structural equality of functions. */
    }
  }
  return 1;  /* Types are compatible. */
}